

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

RepeatedField<unsigned_int> * __thiscall
google::protobuf::Reflection::GetRaw<google::protobuf::RepeatedField<unsigned_int>>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  OneofDescriptor *pOVar3;
  RepeatedField<unsigned_int> *pRVar4;
  LogMessage *this_00;
  LogMessage aLStack_28 [16];
  
  pOVar3 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar3 != (OneofDescriptor *)0x0) {
    bVar1 = HasOneofField(this,message,field);
    if (!bVar1) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)aLStack_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/message.h"
                 ,0x659,0x3c,"!schema_.InRealOneof(field) || HasOneofField(message, field)");
      this_00 = absl::lts_20240722::log_internal::LogMessage::operator<<
                          (aLStack_28,(char (*) [9])"Field = ");
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (this_00,(string *)(field->all_names_ + 1));
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)aLStack_28);
    }
  }
  pOVar3 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    pRVar4 = GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
    return pRVar4;
  }
  bVar1 = internal::ReflectionSchema::IsSplit(&this->schema_,field);
  if (!bVar1) {
    uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    return (RepeatedField<unsigned_int> *)
           ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)aLStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/message.h"
             ,0x661,0x17,"!schema_.IsSplit(field)");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_28)
  ;
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field) || HasOneofField(message, field))
      << "Field = " << field->full_name();

  if (PROTOBUF_PREDICT_TRUE(!schema_.InRealOneof(field))) {
    return GetRawNonOneof<Type>(message, field);
  }

  // Oneof fields are not split.
  ABSL_DCHECK(!schema_.IsSplit(field));

  const uint32_t field_offset = schema_.GetFieldOffset(field);
  return internal::GetConstRefAtOffset<Type>(message, field_offset);
}